

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O1

string * format_json_value(string *__return_storage_ptr__,string *field,string *value)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  field_type fVar5;
  int iVar6;
  long *plVar7;
  long *plVar8;
  size_type *psVar9;
  char *pcVar10;
  size_type sVar11;
  string escaped;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  char local_38 [8];
  
  fVar5 = test::get_field_type(field);
  if (fVar5 == BOOL) {
    iVar6 = std::__cxx11::string::compare((char *)value);
    pcVar10 = "true";
    if (iVar6 == 0) {
      pcVar10 = "false";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar10,pcVar10 + (ulong)(iVar6 == 0) + 4);
  }
  else if (fVar5 == STRING) {
    local_78 = &local_68;
    local_70 = 0;
    local_68 = 0;
    sVar2 = value->_M_string_length;
    if (sVar2 != 0) {
      pcVar3 = (value->_M_dataplus)._M_p;
      sVar11 = 0;
      do {
        cVar1 = pcVar3[sVar11];
        if ((cVar1 == '\\') || (cVar1 == '\"')) {
          std::__cxx11::string::append((char *)&local_78);
        }
        else if (cVar1 < ' ') {
          snprintf(local_38,8,"\\u%04x");
          std::__cxx11::string::append((char *)&local_78);
        }
        else {
          std::__cxx11::string::push_back((char)&local_78);
        }
        sVar11 = sVar11 + 1;
      } while (sVar2 != sVar11);
    }
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x140824);
    plVar8 = plVar7 + 2;
    if ((long *)*plVar7 == plVar8) {
      local_48 = *plVar8;
      lStack_40 = plVar7[3];
      local_58 = &local_48;
    }
    else {
      local_48 = *plVar8;
      local_58 = (long *)*plVar7;
    }
    local_50 = plVar7[1];
    *plVar7 = (long)plVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_58);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar9) {
      lVar4 = plVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_58 != &local_48) {
      operator_delete(local_58,local_48 + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (value->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + value->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string format_json_value(const std::string & field, const std::string & value) {
    switch (test::get_field_type(field)) {
        case test::STRING:
            return "\"" + escape_json(value) + "\"";
        case test::BOOL:
            return value == "0" ? "false" : "true";
        default:
            return value;
    }
}